

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> * __thiscall
pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&),pybind11::return_value_policy>
          (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *this,char *name_,
          offset_in_Var_to_subr *f,return_value_policy *extra)

{
  name *extra_00;
  handle local_68;
  is_method local_60;
  sibling local_58;
  offset_in_Var_to_subr local_50;
  object local_48;
  cpp_function local_40;
  cpp_function cf;
  
  local_50 = *f;
  extra_00 = (name *)f[1];
  local_58.value.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_60.class_.m_ptr = (handle)(handle)name_;
  cf.super_function.super_object.super_handle.m_ptr = (function)PyObject_GetAttrString();
  if ((handle)cf.super_function.super_object.super_handle.m_ptr == (handle)0x0) {
    PyErr_Clear();
    cf.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_68.m_ptr = (PyObject *)cf.super_function.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<std::shared_ptr<kratos::FSMState>,kratos::FSM,std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
            (&local_40,local_50,extra_00,&local_60,&local_58,(return_value_policy *)&local_68);
  object::~object((object *)&cf);
  object::~object(&local_48);
  detail::add_class_method((object *)this,name_,&local_40);
  object::~object((object *)&local_40);
  return (class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }